

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

HighsStatus
formSimplexLpBasisAndFactor(HighsLpSolverObject *solver_object,bool only_from_known_basis)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this;
  HighsBasis *highs_basis;
  HighsOptions *options;
  HEkk *this_00;
  HighsStatus HVar1;
  HighsLp *pHVar2;
  string local_b8;
  HighsLogOptions local_98;
  
  pHVar2 = solver_object->lp_;
  highs_basis = solver_object->basis_;
  options = solver_object->options_;
  this_00 = solver_object->ekk_instance_;
  HighsSparseMatrix::ensureColwise(&pHVar2->a_matrix_);
  considerScaling(options,pHVar2);
  if ((highs_basis->alien != false) ||
     ((highs_basis->valid == false && (highs_basis->useful == true)))) {
    highs_basis->alien = true;
    accommodateAlienBasis(solver_object);
    highs_basis->alien = false;
    HighsLp::unapplyScale(pHVar2);
    return kOk;
  }
  HEkk::moveLp(this_00,solver_object);
  if ((this_00->status_).has_basis == false) {
    HVar1 = HEkk::setBasis(this_00,highs_basis);
    local_98.log_stream = (options->super_HighsOptionsStruct).log_options.log_stream;
    local_98.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
    local_98.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
    local_98.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
    local_98.user_log_callback = (options->super_HighsOptionsStruct).log_options.user_log_callback;
    local_98.user_log_callback_data =
         (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
    this = &local_98.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(this,&(options->super_HighsOptionsStruct).log_options.user_callback);
    local_98.user_callback_active =
         (options->super_HighsOptionsStruct).log_options.user_callback_active;
    local_98.user_callback_data = (options->super_HighsOptionsStruct).log_options.user_callback_data
    ;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"setBasis","");
    HVar1 = interpretCallStatus(&local_98,HVar1,kOk,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.user_callback.super__Function_base._M_manager)
                ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
    }
    if (HVar1 == kError) {
      pHVar2 = solver_object->lp_;
      HVar1 = kError;
      if (pHVar2->is_moved_ != true) {
        return kError;
      }
      goto LAB_00256b8e;
    }
  }
  HVar1 = HEkk::initialiseSimplexLpBasisAndFactor(this_00,only_from_known_basis);
  pHVar2 = solver_object->lp_;
  if (HVar1 == kOk) {
    HVar1 = kOk;
  }
  else {
    HVar1 = kError;
  }
  if (pHVar2->is_moved_ == false) {
    return HVar1;
  }
LAB_00256b8e:
  HighsLp::moveBackLpAndUnapplyScaling(pHVar2,&solver_object->ekk_instance_->lp_);
  return HVar1;
}

Assistant:

HighsStatus formSimplexLpBasisAndFactor(HighsLpSolverObject& solver_object,
                                        const bool only_from_known_basis) {
  // Ideally, forms a SimplexBasis from the HighsBasis in the
  // HighsLpSolverObject
  //
  // If only_from_known_basis is true and
  // initialiseSimplexLpBasisAndFactor finds that there is no simplex
  // basis, then its error return is passed down
  //
  // If only_from_known_basis is false, then the basis is completed
  // with logicals if it is rank deficient (from singularity or being
  // incomplete)
  //
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  HighsLp& lp = solver_object.lp_;
  HighsBasis& basis = solver_object.basis_;
  HighsOptions& options = solver_object.options_;
  HEkk& ekk_instance = solver_object.ekk_instance_;
  HighsSimplexStatus& ekk_status = ekk_instance.status_;
  lp.ensureColwise();
  // Consider scaling the LP
  const bool new_scaling = considerScaling(options, lp);
  const bool check_basis = basis.alien || (!basis.valid && basis.useful);
  if (check_basis) {
    // The basis needs to be checked for rank deficiency, and possibly
    // completed if it is rectangular
    //
    // If it's not valid but useful, but not alien,
    // accommodateAlienBasis will assert, so make the basis alien
    basis.alien = true;
    assert(!only_from_known_basis);
    accommodateAlienBasis(solver_object);
    basis.alien = false;
    lp.unapplyScale();
    return HighsStatus::kOk;
  }
  // Move the HighsLpSolverObject's LP to EKK
  ekk_instance.moveLp(solver_object);
  if (!ekk_status.has_basis) {
    // The Ekk instance has no simplex basis, so pass the HiGHS basis
    HighsStatus call_status = ekk_instance.setBasis(basis);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "setBasis");
    if (return_status == HighsStatus::kError)
      return formSimplexLpBasisAndFactorReturn(return_status, solver_object);
  }
  // Now form the invert
  assert(ekk_status.has_basis);
  call_status =
      ekk_instance.initialiseSimplexLpBasisAndFactor(only_from_known_basis);
  // If the current basis cannot be inverted, return an error
  if (call_status != HighsStatus::kOk)
    return formSimplexLpBasisAndFactorReturn(HighsStatus::kError,
                                             solver_object);
  // Once the invert is formed, move back the LP and remove any scaling.
  return formSimplexLpBasisAndFactorReturn(HighsStatus::kOk, solver_object);
}